

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.h
# Opt level: O3

void __thiscall
jrtplib::RTPUDPv6TransmissionParams::~RTPUDPv6TransmissionParams(RTPUDPv6TransmissionParams *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  (this->super_RTPTransmissionParams)._vptr_RTPTransmissionParams =
       (_func_int **)&PTR__RTPUDPv6TransmissionParams_0013c3e0;
  p_Var2 = (this->localIPs).super__List_base<in6_addr,_std::allocator<in6_addr>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->localIPs) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x20);
    p_Var2 = p_Var1;
  }
  operator_delete(this,0x60);
  return;
}

Assistant:

class JRTPLIB_IMPORTEXPORT RTPUDPv6TransmissionParams : public RTPTransmissionParams
{
public:
	RTPUDPv6TransmissionParams();

	/** Sets the IP address which is used to bind the sockets to \c ip. */
	void SetBindIP(in6_addr ip)											{ bindIP = ip; }

	/** Sets the multicast interface index. */
	void SetMulticastInterfaceIndex(unsigned int idx)					{ mcastifidx = idx; }

	/** Sets the RTP portbase to \c pbase. This has to be an even number. */
	void SetPortbase(uint16_t pbase)									{ portbase = pbase; }

	/** Sets the multicast TTL to be used to \c mcastTTL. */
	void SetMulticastTTL(uint8_t mcastTTL)								{ multicastTTL = mcastTTL; }

	/** Passes a list of IP addresses which will be used as the local IP addresses. */
	void SetLocalIPList(std::list<in6_addr> &iplist)					{ localIPs = iplist; } 

	/** Clears the list of local IP addresses.
	 *  Clears the list of local IP addresses. An empty list will make the transmission component 
	 *  itself determine the local IP addresses.
	 */
	void ClearLocalIPList()												{ localIPs.clear(); }

	/** Returns the IP address which will be used to bind the sockets. */
	in6_addr GetBindIP() const											{ return bindIP; }

	/** Returns the multicast interface index. */
	unsigned int GetMulticastInterfaceIndex() const						{ return mcastifidx; }

	/** Returns the RTP portbase which will be used (default is 5000). */
	uint16_t GetPortbase() const										{ return portbase; }

	/** Returns the multicast TTL which will be used (default is 1). */
	uint8_t GetMulticastTTL() const										{ return multicastTTL; }

	/** Returns the list of local IP addresses. */
	const std::list<in6_addr> &GetLocalIPList() const					{ return localIPs; }

	/** Sets the RTP socket's send buffer size. */
	void SetRTPSendBuffer(int s)								{ rtpsendbuf = s; }

	/** Sets the RTP socket's receive buffer size. */
	void SetRTPReceiveBuffer(int s)								{ rtprecvbuf = s; }

	/** Sets the RTCP socket's send buffer size. */
	void SetRTCPSendBuffer(int s)								{ rtcpsendbuf = s; }

	/** Sets the RTCP socket's receive buffer size. */
	void SetRTCPReceiveBuffer(int s)							{ rtcprecvbuf = s; }

	/** If non null, the specified abort descriptors will be used to cancel
	 *  the function that's waiting for packets to arrive; set to null (the default
	 *  to let the transmitter create its own instance. */
	void SetCreatedAbortDescriptors(RTPAbortDescriptors *desc) { m_pAbortDesc = desc; }

	/** Returns the RTP socket's send buffer size. */
	int GetRTPSendBuffer() const								{ return rtpsendbuf; }

	/** Returns the RTP socket's receive buffer size. */
	int GetRTPReceiveBuffer() const								{ return rtprecvbuf; }

	/** Returns the RTCP socket's send buffer size. */
	int GetRTCPSendBuffer() const								{ return rtcpsendbuf; }

	/** Returns the RTCP socket's receive buffer size. */
	int GetRTCPReceiveBuffer() const							{ return rtcprecvbuf; }

	/** If non-null, this RTPAbortDescriptors instance will be used internally,
	 *  which can be useful when creating your own poll thread for multiple
	 *  sessions. */
	RTPAbortDescriptors *GetCreatedAbortDescriptors() const		{ return m_pAbortDesc; }
private:
	uint16_t portbase;
	in6_addr bindIP;
	unsigned int mcastifidx;
	std::list<in6_addr> localIPs;
	uint8_t multicastTTL;
	int rtpsendbuf, rtprecvbuf;
	int rtcpsendbuf, rtcprecvbuf;

	RTPAbortDescriptors *m_pAbortDesc;
}